

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::FCDUIterCollationIterator::nextCodePoint
          (FCDUIterCollationIterator *this,UErrorCode *errorCode)

{
  short sVar1;
  State SVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  do {
    while (SVar2 = this->state, SVar2 == ITER_IN_FCD_SEGMENT) {
      if (this->pos != this->limit) {
        uVar4 = uiter_next32_63((this->super_UIterCollationIterator).iter);
LAB_002255d2:
        this->pos = (this->pos - (uint)(uVar4 < 0x10000)) + 2;
        return uVar4;
      }
LAB_0022555a:
      switchToForward(this);
    }
    if (SVar2 != ITER_CHECK_FWD) {
      if (2 < (int)SVar2) {
        sVar1 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (this->normalized).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        if (this->pos != iVar6) {
          uVar4 = UnicodeString::char32At(&this->normalized,this->pos);
          goto LAB_002255d2;
        }
      }
      goto LAB_0022555a;
    }
    uVar4 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
    if ((int)uVar4 < 0) {
      return uVar4;
    }
    if ((((uVar4 < 0xc0) || ((ulong)(byte)CollationFCD::tcccIndex[uVar4 >> 5] == 0)) ||
        ((*(uint *)(CollationFCD::tcccBits + (ulong)(byte)CollationFCD::tcccIndex[uVar4 >> 5] * 4)
          >> (uVar4 & 0x1f) & 1) == 0)) ||
       (((uVar4 & 0x1fff01) != 0xf01 &&
        (((uVar5 = (*(code *)((this->super_UIterCollationIterator).iter)->current)(),
          (int)uVar5 < 0x300 || ((ulong)(byte)CollationFCD::lcccIndex[uVar5 >> 5] == 0)) ||
         ((*(uint *)(CollationFCD::lcccBits + (ulong)(byte)CollationFCD::lcccIndex[uVar5 >> 5] * 4)
           >> (uVar5 & 0x1f) & 1) == 0)))))) {
      if ((uVar4 & 0x7ffffc00) != 0xd800) {
        return uVar4;
      }
      uVar5 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
      if ((uVar5 & 0xfffffc00) == 0xdc00) {
        return uVar4 * 0x400 + uVar5 + -0x35fdc00;
      }
      if ((int)uVar5 < 0) {
        return uVar4;
      }
      (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
      return uVar4;
    }
    (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
    UVar3 = nextSegment(this,errorCode);
    if (UVar3 == '\0') {
      return -1;
    }
  } while( true );
}

Assistant:

UChar32
FCDUIterCollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == ITER_CHECK_FWD) {
            c = iter.next(&iter);
            if(c < 0) {
                return c;
            }
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        CollationFCD::hasLccc(iter.current(&iter))) {
                    iter.previous(&iter);
                    if(!nextSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    continue;
                }
            }
            if(U16_IS_LEAD(c)) {
                UChar32 trail = iter.next(&iter);
                if(U16_IS_TRAIL(trail)) {
                    return U16_GET_SUPPLEMENTARY(c, trail);
                } else if(trail >= 0) {
                    iter.previous(&iter);
                }
            }
            return c;
        } else if(state == ITER_IN_FCD_SEGMENT && pos != limit) {
            c = uiter_next32(&iter);
            pos += U16_LENGTH(c);
            U_ASSERT(c >= 0);
            return c;
        } else if(state >= IN_NORM_ITER_AT_LIMIT && pos != normalized.length()) {
            c = normalized.char32At(pos);
            pos += U16_LENGTH(c);
            return c;
        } else {
            switchToForward();
        }
    }
}